

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O2

bool __thiscall
cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
          (cmGeneratorExpressionDAGChecker *this,char *tgt)

{
  bool bVar1;
  int iVar2;
  cmGeneratorExpressionDAGChecker *pcVar3;
  char *__s2;
  char *__s1;
  char *prop;
  char *local_18;
  
  do {
    pcVar3 = this;
    this = pcVar3->Parent;
  } while (pcVar3->Parent != (cmGeneratorExpressionDAGChecker *)0x0);
  __s1 = (pcVar3->Property)._M_dataplus._M_p;
  local_18 = __s1;
  if (tgt == (char *)0x0) {
    iVar2 = strcmp(__s1,"LINK_LIBRARIES");
    if (iVar2 == 0) {
      return true;
    }
    iVar2 = strcmp(__s1,"LINK_INTERFACE_LIBRARIES");
    if (iVar2 == 0) {
      return true;
    }
    iVar2 = strcmp(__s1,"IMPORTED_LINK_INTERFACE_LIBRARIES");
    if (iVar2 == 0) {
      return true;
    }
    bVar1 = cmHasLiteralPrefix<char_const*,26ul>(&local_18,(char (*) [26])0x5eab31);
    if (bVar1) {
      return true;
    }
    bVar1 = cmHasLiteralPrefix<char_const*,35ul>
                      (&local_18,(char (*) [35])"IMPORTED_LINK_INTERFACE_LIBRARIES_");
    if (bVar1) {
      return true;
    }
    __s2 = "INTERFACE_LINK_LIBRARIES";
    __s1 = local_18;
  }
  else {
    bVar1 = std::operator==(&pcVar3->Target,tgt);
    if (!bVar1) {
      return false;
    }
    __s2 = "LINK_LIBRARIES";
  }
  iVar2 = strcmp(__s1,__s2);
  return iVar2 == 0;
}

Assistant:

bool cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries(const char* tgt)
{
  const cmGeneratorExpressionDAGChecker* top = this;
  const cmGeneratorExpressionDAGChecker* parent = this->Parent;
  while (parent) {
    top = parent;
    parent = parent->Parent;
  }

  const char* prop = top->Property.c_str();

  if (tgt) {
    return top->Target == tgt && strcmp(prop, "LINK_LIBRARIES") == 0;
  }

  return (strcmp(prop, "LINK_LIBRARIES") == 0 ||
          strcmp(prop, "LINK_INTERFACE_LIBRARIES") == 0 ||
          strcmp(prop, "IMPORTED_LINK_INTERFACE_LIBRARIES") == 0 ||
          cmHasLiteralPrefix(prop, "LINK_INTERFACE_LIBRARIES_") ||
          cmHasLiteralPrefix(prop, "IMPORTED_LINK_INTERFACE_LIBRARIES_")) ||
    strcmp(prop, "INTERFACE_LINK_LIBRARIES") == 0;
}